

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_luma_mode2
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  UWORD8 *pUVar5;
  
  if (0 < nt) {
    iVar2 = nt * 2 + -2;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      uVar3 = (ulong)(uint)nt;
      pUVar5 = pu1_dst;
      iVar4 = iVar2;
      do {
        *pUVar5 = pu1_ref[iVar4];
        pUVar5 = pUVar5 + dst_strd;
        iVar4 = iVar4 + -1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      pu1_dst = pu1_dst + 1;
      iVar2 = iVar2 + -1;
    } while (uVar1 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode2(UWORD8 *pu1_ref,
                                 WORD32 src_strd,
                                 UWORD8 *pu1_dst,
                                 WORD32 dst_strd,
                                 WORD32 nt,
                                 WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang = 32;
    WORD32 idx = 0;
    UNUSED(mode);
    UNUSED(src_strd);
    /* For the angle 45, replication is done from the corresponding angle */
    /* intra_pred_ang = tan(angle) in q5 format */
    for(col = 0; col < nt; col++)
    {
        idx = ((col + 1) * intra_pred_ang) >> 5; /* Use idx++ */

        for(row = 0; row < nt; row++)
            pu1_dst[col + (row * dst_strd)] = pu1_ref[two_nt - row - idx - 1];
    }

}